

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_history(CHAR_DATA *ch,char *argument)

{
  char *__src;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CHAR_DATA *ch_00;
  size_t sVar4;
  ulong uVar5;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  char arg2 [4608];
  char obuf [4608];
  char arg1 [4608];
  long *local_3898 [2];
  long local_3888 [2];
  char *local_3878 [3];
  buffer<char> local_3860;
  char local_3840 [504];
  int local_3648;
  short local_3644;
  char local_2448 [4608];
  char local_1248 [4648];
  
  pcVar3 = one_argument(argument,local_1248);
  pcVar3 = one_argument(pcVar3,(char *)&local_3648);
  if (local_1248[0] == '\0') {
    send_to_char("Syntax: history <character>          = read a character\'s history\n\r",ch);
    send_to_char("        history <character> + <info> = add to the temporary buffer\n\r",ch);
    send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r"
                 ,ch);
    send_to_char("        history <character> show     = shows the temporary buffer\n\r",ch);
    send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r"
                 ,ch);
    pcVar3 = "        history <character> clear    = clear a player\'s history (IMP ONLY)\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1248);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char("They aren\'t here, attempting offline history...\n\r",ch);
      local_3860.size_ = 0;
      local_3860._vptr_buffer = (_func_int **)&PTR_grow_00457340;
      local_3860.capacity_ = 500;
      fmt.size_ = 0x11;
      fmt.data_ = "finger {} history";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_3878;
      args.desc_ = 0xc;
      local_3878[0] = local_1248;
      local_3860.ptr_ = local_3840;
      ::fmt::v9::detail::vformat_to<char>(&local_3860,fmt,args,(locale_ref)0x0);
      local_3898[0] = local_3888;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3898,local_3860.ptr_,local_3860.ptr_ + local_3860.size_);
      if (local_3860.ptr_ != local_3840) {
        operator_delete(local_3860.ptr_,local_3860.capacity_);
      }
      interpret(ch,(char *)local_3898[0]);
      if (local_3898[0] == local_3888) {
        return;
      }
      operator_delete(local_3898[0],local_3888[0] + 1);
      return;
    }
    bVar1 = is_npc(ch_00);
    if (bVar1) {
      pcVar3 = "You can\'t history a mob.\n\r";
    }
    else {
      if ((ch_00->level < ch->level) || (iVar2 = get_trust(ch), 0x3b < iVar2)) {
        if ((char)local_3648 != '\0') {
          if (local_3644 == 0x72 && local_3648 == 0x61656c63) {
            bVar1 = IS_IMP(ch);
            if (!bVar1) {
              pcVar3 = "You are not permitted to complete that operation.\n\r";
              goto LAB_002766eb;
            }
            ch_00->pcdata->history_buffer = (char *)0x0;
          }
          if (local_3648 != 0x646461) {
            if ((char)local_3644 != '\0' || local_3648 != 0x776f6873) {
              if ((short)local_3648 == 0x2b) {
                if (*pcVar3 == '\0') {
                  pcVar3 = "Add what?\n\r";
                  goto LAB_002766eb;
                }
                local_2448[0] = '\0';
                __src = ch_00->pcdata->temp_history_buffer;
                if (__src != (char *)0x0) {
                  strcat(local_2448,__src);
                }
                smash_tilde(pcVar3);
                strcat(local_2448,pcVar3);
                sVar4 = strlen(local_2448);
                (local_2448 + sVar4)[0] = '\n';
                (local_2448 + sVar4)[1] = '\r';
                local_2448[sVar4 + 2] = '\0';
                free_pstring(ch_00->pcdata->temp_history_buffer);
                pcVar3 = palloc_string(local_2448);
                ch_00->pcdata->temp_history_buffer = pcVar3;
                show_temp_history(ch,ch_00);
              }
              if ((short)local_3648 != 0x2d) {
                return;
              }
              pcVar3 = ch_00->pcdata->temp_history_buffer;
              if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
                pcVar3 = "No lines left to remove.\n\r";
                goto LAB_002766eb;
              }
              strcpy(local_2448,pcVar3);
              uVar5 = strlen(local_2448);
              if (0 < (int)uVar5) {
                bVar1 = false;
                do {
                  iVar2 = (int)uVar5;
                  if (local_2448[uVar5 & 0xffffffff] == '\r') {
                    if (bVar1) {
                      local_2448[(uVar5 & 0xffffffff) + 1] = '\0';
                      goto LAB_00276a0c;
                    }
                    iVar2 = iVar2 + -1;
                    bVar1 = true;
                  }
                  uVar5 = (ulong)(iVar2 - 1);
                } while (1 < iVar2);
              }
              local_2448[0] = '\0';
LAB_00276a0c:
              free_pstring(ch_00->pcdata->temp_history_buffer);
              pcVar3 = palloc_string(local_2448);
              ch_00->pcdata->temp_history_buffer = pcVar3;
            }
            show_temp_history(ch,ch_00);
            return;
          }
          pcVar3 = ch_00->pcdata->temp_history_buffer;
          if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
            pcVar3 = "The temporary buffer for that character is empty.\n\r";
            goto LAB_002766eb;
          }
          add_history(ch,ch_00,pcVar3);
          free_pstring(ch_00->pcdata->temp_history_buffer);
          ch_00->pcdata->temp_history_buffer = (char *)0x0;
        }
        show_history(ch,ch_00);
        return;
      }
      pcVar3 = "Access denied.\n\r";
    }
  }
LAB_002766eb:
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_history(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int len;
	bool found = false;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: history <character>          = read a character's history\n\r", ch);
		send_to_char("        history <character> + <info> = add to the temporary buffer\n\r", ch);
		send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r", ch);
		send_to_char("        history <character> show     = shows the temporary buffer\n\r", ch);
		send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r", ch);
		send_to_char("        history <character> clear    = clear a player's history (IMP ONLY)\n\r", ch);
		return;
	}

	victim = get_char_world(ch,arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here, attempting offline history...\n\r", ch);
		auto buffer = fmt::format("finger {} history", arg1);
		interpret(ch, buffer.data());
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You can't history a mob.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		show_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "clear"))
	{
		if (!IS_IMP(ch))
		{
			send_to_char("You are not permitted to complete that operation.\n\r", ch);
			return;
		}

		victim->pcdata->history_buffer = nullptr;
	}

	if (!strcmp(arg2, "add"))
	{
		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("The temporary buffer for that character is empty.\n\r", ch);
			return;
		}
		else
		{
			add_history(ch, victim, victim->pcdata->temp_history_buffer);

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = nullptr;

			show_history(ch, victim);
		}

		return;
	}

	if (!strcmp(arg2, "show"))
	{
		show_temp_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "+"))
	{
		if (argument[0] != '\0')
		{
			obuf[0] = '\0';
			if (victim->pcdata->temp_history_buffer)
			{
				strcat(obuf, victim->pcdata->temp_history_buffer);
			}
			smash_tilde(argument);
			strcat(obuf, argument);
			strcat(obuf, "\n\r");

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = palloc_string(obuf);
		}
		else
		{
			send_to_char("Add what?\n\r", ch);
			return;
		}

		show_temp_history(ch, victim);
	}

	if (!strcmp(arg2, "-"))
	{

		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("No lines left to remove.\n\r", ch);
			return;
		}

		strcpy(obuf, victim->pcdata->temp_history_buffer);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
					{
						len--;
					}
					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(victim->pcdata->temp_history_buffer);
					victim->pcdata->temp_history_buffer = palloc_string(obuf);
					show_temp_history(ch, victim);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(victim->pcdata->temp_history_buffer);
		victim->pcdata->temp_history_buffer = palloc_string(obuf);

		show_temp_history(ch, victim);
	}
}